

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpos.h
# Opt level: O0

uint32_t get_pos_slot_2(uint32_t pos)

{
  uint32_t local_c;
  uint32_t pos_local;
  
  if (0x7f < pos) {
    if (pos < 0x80000) {
      local_c = ""[pos >> 6] + 0xc;
    }
    else if (pos < 0x80000000) {
      local_c = ""[pos >> 0x12] + 0x24;
    }
    else {
      local_c = ""[pos >> 0x1e] + 0x3c;
    }
    return local_c;
  }
  __assert_fail("pos >= FULL_DISTANCES",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/fastpos.h"
                ,0x80,"uint32_t get_pos_slot_2(uint32_t)");
}

Assistant:

static inline uint32_t
get_pos_slot_2(uint32_t pos)
{
	assert(pos >= FULL_DISTANCES);

	if (pos < fastpos_limit(FULL_DISTANCES_BITS - 1, 0))
		return fastpos_result(pos, FULL_DISTANCES_BITS - 1, 0);

	if (pos < fastpos_limit(FULL_DISTANCES_BITS - 1, 1))
		return fastpos_result(pos, FULL_DISTANCES_BITS - 1, 1);

	return fastpos_result(pos, FULL_DISTANCES_BITS - 1, 2);
}